

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O0

type jsoncons::detail::
     decode_base64_generic<char_const*,bool(*)(char),jsoncons::basic_byte_string<std::allocator<unsigned_char>>>
               (char *first,char *last,uint8_t *reverse_alphabet,_func_bool_char *f,
               basic_byte_string<std::allocator<unsigned_char>_> *result)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  code *in_RCX;
  char *pcVar4;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar5;
  type tVar6;
  uint8_t j;
  uint8_t i;
  uint8_t a3 [3];
  uint8_t a4 [4];
  uint8_t b;
  byte bVar7;
  byte bVar8;
  char in_stack_ffffffffffffffc3;
  char in_stack_ffffffffffffffc4;
  byte in_stack_ffffffffffffffc5;
  byte in_stack_ffffffffffffffc6;
  char in_stack_ffffffffffffffc7;
  char *local_18;
  char *local_10;
  undefined4 local_8;
  
  b = '\0';
  bVar8 = 0;
  local_18 = in_RDI;
  while( true ) {
    bVar5 = false;
    if (local_18 != in_RSI) {
      bVar5 = *local_18 != '=';
    }
    if (!bVar5) break;
    uVar3 = (*in_RCX)((int)*local_18);
    if ((uVar3 & 1) == 0) {
      local_10 = local_18;
      local_8 = 1;
LAB_00324368:
      tVar6.ec = local_8;
      tVar6.it = local_10;
      tVar6._12_4_ = 0;
      return tVar6;
    }
    pcVar4 = local_18 + 1;
    bVar7 = bVar8 + 1;
    (&stack0xffffffffffffffc4)[bVar8] = *local_18;
    bVar8 = bVar7;
    local_18 = pcVar4;
    if (bVar7 == 4) {
      for (bVar8 = 0; bVar8 < 4; bVar8 = bVar8 + 1) {
        (&stack0xffffffffffffffc4)[bVar8] =
             *(undefined1 *)(in_RDX + (ulong)(byte)(&stack0xffffffffffffffc4)[bVar8]);
      }
      cVar1 = in_stack_ffffffffffffffc4 * '\x04' +
              (char)((int)(in_stack_ffffffffffffffc5 & 0x30) >> 4);
      cVar2 = in_stack_ffffffffffffffc5 * '\x10' +
              (char)((int)(in_stack_ffffffffffffffc6 & 0x3c) >> 2);
      in_stack_ffffffffffffffc3 = in_stack_ffffffffffffffc6 * '@' + in_stack_ffffffffffffffc7;
      for (bVar8 = 0; bVar8 < 3; bVar8 = bVar8 + 1) {
        basic_byte_string<std::allocator<unsigned_char>_>::push_back
                  ((basic_byte_string<std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_ffffffffffffffc7,
                            CONCAT16(in_stack_ffffffffffffffc6,
                                     CONCAT15(in_stack_ffffffffffffffc5,
                                              CONCAT14(in_stack_ffffffffffffffc4,
                                                       CONCAT13(in_stack_ffffffffffffffc3,
                                                                CONCAT12(cVar2,CONCAT11(cVar1,bVar8)
                                                                        )))))),b);
      }
      bVar8 = 0;
    }
  }
  if (bVar8 != 0) {
    for (bVar7 = 0; bVar7 < bVar8; bVar7 = bVar7 + 1) {
      (&stack0xffffffffffffffc4)[bVar7] =
           *(undefined1 *)(in_RDX + (ulong)(byte)(&stack0xffffffffffffffc4)[bVar7]);
    }
    cVar1 = in_stack_ffffffffffffffc4 * '\x04' +
            (char)((int)(in_stack_ffffffffffffffc5 & 0x30) >> 4);
    cVar2 = in_stack_ffffffffffffffc5 * '\x10' +
            (char)((int)(in_stack_ffffffffffffffc6 & 0x3c) >> 2);
    for (bVar7 = 0; (int)(uint)bVar7 < (int)(bVar8 - 1); bVar7 = bVar7 + 1) {
      basic_byte_string<std::allocator<unsigned_char>_>::push_back
                ((basic_byte_string<std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_ffffffffffffffc7,
                          CONCAT16(in_stack_ffffffffffffffc6,
                                   CONCAT15(in_stack_ffffffffffffffc5,
                                            CONCAT14(in_stack_ffffffffffffffc4,
                                                     CONCAT13(in_stack_ffffffffffffffc3,
                                                              CONCAT12(cVar2,CONCAT11(cVar1,bVar8)))
                                                    )))),bVar7);
    }
  }
  local_8 = 0;
  local_10 = in_RSI;
  goto LAB_00324368;
}

Assistant:

typename std::enable_if<ext_traits::is_back_insertable_byte_container<Container>::value,decode_result<InputIt>>::type 
    decode_base64_generic(InputIt first, InputIt last, 
                          const uint8_t reverse_alphabet[256],
                          F f,
                          Container& result)
    {
        uint8_t a4[4], a3[3];
        uint8_t i = 0;
        uint8_t j = 0;

        while (first != last && *first != '=')
        {
            if (!f(*first))
            {
                return decode_result<InputIt>{first, conv_errc::conversion_failed};
            }

            a4[i++] = static_cast<uint8_t>(*first++); 
            if (i == 4)
            {
                for (i = 0; i < 4; ++i) 
                {
                    a4[i] = reverse_alphabet[a4[i]];
                }

                a3[0] = (a4[0] << 2) + ((a4[1] & 0x30) >> 4);
                a3[1] = ((a4[1] & 0xf) << 4) + ((a4[2] & 0x3c) >> 2);
                a3[2] = ((a4[2] & 0x3) << 6) +   a4[3];

                for (i = 0; i < 3; i++) 
                {
                    result.push_back(a3[i]);
                }
                i = 0;
            }
        }

        if (i > 0)
        {
            for (j = 0; j < i; ++j) 
            {
                a4[j] = reverse_alphabet[a4[j]];
            }

            a3[0] = (a4[0] << 2) + ((a4[1] & 0x30) >> 4);
            a3[1] = ((a4[1] & 0xf) << 4) + ((a4[2] & 0x3c) >> 2);

            for (j = 0; j < i - 1; ++j) 
            {
                result.push_back(a3[j]);
            }
        }
        return decode_result<InputIt>{last, conv_errc::success};
    }